

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O3

void __thiscall
dlib::array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_>::push_back
          (array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *this,
          unsigned_long *item)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long uVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t i;
  ulong uVar12;
  undefined1 local_60 [16];
  undefined1 local_50 [24];
  unsigned_long *puStack_38;
  unsigned_long *local_30;
  bool local_28;
  
  sVar2 = this->max_array_size;
  iVar11 = (*(this->super_enumerable<unsigned_long>)._vptr_enumerable[8])();
  if (sVar2 == CONCAT44(extraout_var,iVar11)) {
    local_60._0_8_ = &PTR__array_001fab90;
    local_60._8_8_ = &PTR__memory_manager_stateless_kernel_1_001fac10;
    _local_50 = ZEXT1632(ZEXT816(0) << 0x40);
    local_30 = (unsigned_long *)0x0;
    local_28 = true;
    iVar11 = (*(this->super_enumerable<unsigned_long>)._vptr_enumerable[8])(this);
    set_max_size((array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *)local_60,
                 CONCAT44(extraout_var_00,iVar11) * 2 + 1);
    iVar11 = (*(this->super_enumerable<unsigned_long>)._vptr_enumerable[8])(this);
    set_size((array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *)local_60,
             CONCAT44(extraout_var_01,iVar11) + 1);
    uVar12 = 0;
    while( true ) {
      iVar11 = (*(this->super_enumerable<unsigned_long>)._vptr_enumerable[8])(this);
      uVar10 = local_50._16_8_;
      if (CONCAT44(extraout_var_02,iVar11) <= uVar12) break;
      uVar3 = this->array_elements[uVar12];
      this->array_elements[uVar12] = *(unsigned_long *)(local_50._16_8_ + uVar12 * 8);
      *(unsigned_long *)(local_50._16_8_ + uVar12 * 8) = uVar3;
      uVar12 = uVar12 + 1;
    }
    bVar1 = this->_at_start;
    uVar8 = local_50._0_8_;
    uVar3 = *item;
    this->_at_start = local_28;
    puVar5 = puStack_38;
    *item = *(unsigned_long *)(local_50._16_8_ + (local_50._0_8_ - 1) * 8);
    *(unsigned_long *)(local_50._16_8_ + (local_50._0_8_ - 1) * 8) = uVar3;
    uVar9 = local_50._8_8_;
    uVar6 = this->array_size;
    uVar7 = this->max_array_size;
    local_50._8_8_ = uVar7;
    local_50._0_8_ = uVar6;
    this->array_size = uVar8;
    this->max_array_size = uVar9;
    puVar4 = this->array_elements;
    local_50._16_8_ = this->array_elements;
    puStack_38 = this->pos;
    this->array_elements = (unsigned_long *)uVar10;
    this->pos = puVar5;
    puVar5 = this->last_pos;
    this->last_pos = local_30;
    local_60._0_8_ = &PTR__array_001fab90;
    if (puVar4 != (unsigned_long *)0x0) {
      local_30 = puVar5;
      local_28 = bVar1;
      operator_delete__(puVar4);
    }
  }
  else {
    iVar11 = (*(this->super_enumerable<unsigned_long>)._vptr_enumerable[8])(this);
    set_size(this,CONCAT44(extraout_var_03,iVar11) + 1);
    iVar11 = (*(this->super_enumerable<unsigned_long>)._vptr_enumerable[8])(this);
    puVar4 = this->array_elements;
    uVar3 = *item;
    *item = puVar4[CONCAT44(extraout_var_04,iVar11) + -1];
    puVar4[CONCAT44(extraout_var_04,iVar11) + -1] = uVar3;
  }
  return;
}

Assistant:

void array<T,mem_manager>::
    push_back (
        T& item
    ) 
    {
        if (this->max_size() == this->size())
        {
            // double the size of the array
            array temp;
            temp.set_max_size(this->size()*2 + 1);
            temp.set_size(this->size()+1);
            for (size_t i = 0; i < this->size(); ++i)
            {
                exchange((*this)[i],temp[i]);
            }
            exchange(item,temp[temp.size()-1]);
            temp.swap(*this);
        }
        else
        {
            this->set_size(this->size()+1);
            exchange(item,(*this)[this->size()-1]);
        }
    }